

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O2

Matrix<Finite> __thiscall Matrix<Finite>::operator/(Matrix<Finite> *this,Finite *a)

{
  Matrix<Finite> *a_00;
  BigInteger *in_RDX;
  Finite *extraout_RDX;
  Matrix<Finite> MVar1;
  Matrix<Finite> temp;
  Matrix<Finite> local_40;
  BigInteger local_30;
  
  Matrix(&local_40,(Matrix<Finite> *)a);
  BigInteger::BigInteger(&local_30,in_RDX);
  a_00 = operator/=(&local_40,(Finite *)&local_30);
  Matrix(this,a_00);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_30);
  ~Matrix(&local_40);
  MVar1.arr = extraout_RDX;
  MVar1._0_8_ = this;
  return MVar1;
}

Assistant:

inline const Matrix operator/(Field a) const
    {
        Matrix temp(*this);
        return temp /= a;
    }